

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O3

HighsDebugStatus
debugHighsSolution(string *message,HighsOptions *options,HighsModel *model,HighsSolution *solution,
                  HighsBasis *basis,HighsModelStatus model_status,HighsInfo *info)

{
  pointer pcVar1;
  HighsDebugStatus HVar2;
  string local_108;
  HighsInfo highs_info;
  
  HighsInfo::HighsInfo(&highs_info,info);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar1,pcVar1 + message->_M_string_length);
  HVar2 = debugHighsSolution(&local_108,options,&model->lp_,&model->hessian_,solution,basis,
                             model_status,&highs_info,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  HighsInfo::~HighsInfo(&highs_info);
  return HVar2;
}

Assistant:

HighsDebugStatus debugHighsSolution(
    const string message, const HighsOptions& options, const HighsModel& model,
    const HighsSolution& solution, const HighsBasis& basis,
    const HighsModelStatus model_status, const HighsInfo& info) {
  // Non-trivially expensive analysis of a solution to a model
  //
  // Called to check the HiGHS model_status and info
  //
  // Copy the data from info to highs_info so general method can be used
  //
  HighsInfo highs_info = info;
  const bool check_model_status_and_highs_info = true;
  return debugHighsSolution(message, options, model.lp_, model.hessian_,
                            solution, basis, model_status, highs_info,
                            check_model_status_and_highs_info);
}